

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

DynamicTypeHandler * __thiscall
Js::PathTypeHandlerBase::ConvertToTypeWithItemAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance)

{
  bool bVar1;
  ScriptContext *pSVar2;
  ES5ArrayTypeHandler *local_28;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertPathToDictionaryItemAttributesCount =
       pSVar2->convertPathToDictionaryItemAttributesCount + 1;
  bVar1 = Js::JavascriptArray::IsNonES5Array(instance);
  if (bVar1) {
    local_28 = ConvertToES5ArrayType(this,instance);
  }
  else {
    local_28 = (ES5ArrayTypeHandler *)ConvertToDictionaryType(this,instance);
  }
  return (DynamicTypeHandler *)local_28;
}

Assistant:

DynamicTypeHandler* PathTypeHandlerBase::ConvertToTypeWithItemAttributes(DynamicObject* instance)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryItemAttributesCount++;
#endif
        return JavascriptArray::IsNonES5Array(instance) ?
            ConvertToES5ArrayType(instance) : ConvertToDictionaryType(instance);
    }